

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.h
# Opt level: O0

size_t __thiscall
Fixpp::
StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v44::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
::checksum(StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v44::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
           *this)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  ulong local_28;
  size_t sum;
  char *end;
  char *p;
  StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v44::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
  *this_local;
  
  lVar2 = std::streambuf::pbase();
  sVar1 = this->off_;
  pcVar3 = (char *)std::streambuf::pptr();
  local_28 = 0;
  for (end = (char *)(lVar2 + sVar1); end != pcVar3; end = end + 1) {
    local_28 = (long)*end + local_28;
  }
  return local_28 & 0xff;
}

Assistant:

size_t checksum() const
        {
            const char* p = Base::pbase() + off_;
            const char* end = Base::pptr();

            size_t sum = 0;

            while (p != end)
            {
                sum += static_cast<size_t>(*p);
                ++p;
            }

            return sum % 256;
        }